

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# F.cpp
# Opt level: O0

Sequence * __thiscall Finv::operator()(Sequence *__return_storage_ptr__,Finv *this,Sequence *seq)

{
  int iVar1;
  reference pvVar2;
  undefined1 local_240 [8];
  Sequence sbox;
  undefined1 local_190 [8];
  Sequence tmp;
  undefined1 local_128 [8];
  value_type key;
  Sequence expansion;
  Sequence *seq_local;
  Finv *this_local;
  Sequence *permutation;
  
  Sequence::permutation
            ((Sequence *)
             ((long)&key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                     super__Deque_impl_data._M_finish + 0x18),seq,&EXPANSION_PERMUTATION);
  iVar1 = this->m_round;
  this->m_round = iVar1 + 1;
  pvVar2 = std::vector<SequenceD<48>,_std::allocator<SequenceD<48>_>_>::operator[]
                     (&this->m_keys,(long)iVar1);
  SequenceD<48>::SequenceD((SequenceD<48> *)local_128,pvVar2);
  toSequence<48>((Sequence *)
                 &sbox.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node,(SequenceD<48> *)local_128);
  Sequence::operator*((Sequence *)local_190,
                      (Sequence *)
                      ((long)&key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>.
                              _M_impl.super__Deque_impl_data._M_finish + 0x18),
                      (Sequence *)
                      &sbox.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node);
  Sequence::~Sequence((Sequence *)
                      &sbox.m_bits.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node);
  S_function::operator()((Sequence *)local_240,&this->m_sFunction,(Sequence *)local_190);
  Sequence::permutation(__return_storage_ptr__,(Sequence *)local_240,&PERMUTATION_FUNCTION);
  Sequence::~Sequence((Sequence *)local_240);
  Sequence::~Sequence((Sequence *)local_190);
  SequenceD<48>::~SequenceD((SequenceD<48> *)local_128);
  Sequence::~Sequence((Sequence *)
                      ((long)&key.m_other.m_bits.super__Deque_base<int,_std::allocator<int>_>.
                              _M_impl.super__Deque_impl_data._M_finish + 0x18));
  return __return_storage_ptr__;
}

Assistant:

Sequence Finv::operator()(Sequence &seq) {
    auto expansion = seq.permutation(EXPANSION_PERMUTATION);
    // use the indexed intermediate key
    auto key = m_keys[m_round++];
    auto tmp = expansion * toSequence(key);
    auto sbox = m_sFunction(tmp);
    auto permutation = sbox.permutation(PERMUTATION_FUNCTION);
    return permutation;
}